

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

int gai_ComputeCountWithSkip
              (Integer ndim,Integer *lo,Integer *hi,Integer *skip,int *count,Integer *nstride)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  *count = 1;
  if ((int)(uint)ndim < 1) {
    uVar1 = 1;
  }
  else {
    uVar2 = 1;
    do {
      uVar1 = hi[uVar2 - 1] - lo[uVar2 - 1];
      if ((long)uVar1 < 0) {
        return 0;
      }
      if (1 < skip[uVar2 - 1]) {
        uVar1 = uVar1 / (ulong)skip[uVar2 - 1];
      }
      count[uVar2] = (int)uVar1 + 1;
      uVar1 = uVar2 + 1;
      bVar3 = uVar2 != ((uint)ndim & 0x7fffffff);
      uVar2 = uVar1;
    } while (bVar3);
    uVar1 = uVar1 & 0xffffffff;
  }
  *nstride = uVar1;
  return 1;
}

Assistant:

int gai_ComputeCountWithSkip(Integer ndim, Integer *lo, Integer *hi,
                             Integer *skip, int *count, Integer *nstride)
{
#if 1
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  count[0]=1;
  istride++;
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#else
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = 1;
      istride++;
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#endif
}